

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  RTCFilterFunctionN p_Var2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  int iVar35;
  AABBNodeMB4D *node1;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  ulong unaff_RBX;
  size_t mask;
  ulong *puVar40;
  ulong uVar41;
  ulong uVar42;
  undefined4 uVar43;
  ulong uVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  bool bVar48;
  bool bVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined4 uVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar97;
  float fVar100;
  float fVar101;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar102;
  undefined1 auVar103 [16];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_16b1;
  undefined1 local_16b0 [16];
  long local_1698;
  undefined8 local_1690;
  float fStack_1688;
  float fStack_1684;
  Scene *local_1680;
  undefined8 uStack_1678;
  undefined1 local_1670 [16];
  undefined1 local_1660 [16];
  undefined1 local_1650 [16];
  undefined1 local_1640 [16];
  ulong local_1630;
  ulong local_1628;
  undefined1 local_1620 [16];
  ulong local_1610;
  ulong local_1608;
  ulong *local_1600;
  ulong local_15f8;
  RTCFilterFunctionNArguments local_15f0;
  undefined1 local_15c0 [32];
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined1 local_1580 [16];
  undefined1 local_1570 [16];
  undefined1 local_1560 [16];
  undefined1 local_1550 [16];
  undefined1 local_1540 [16];
  float local_1530;
  float fStack_152c;
  float fStack_1528;
  float fStack_1524;
  undefined1 local_1520 [16];
  undefined1 local_1510 [16];
  undefined1 *local_1500;
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [16];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [16];
  undefined1 local_1490 [16];
  undefined1 local_1480 [32];
  int local_1460;
  int iStack_145c;
  int iStack_1458;
  int iStack_1454;
  int iStack_1450;
  int iStack_144c;
  int iStack_1448;
  int iStack_1444;
  int local_1440;
  int iStack_143c;
  int iStack_1438;
  int iStack_1434;
  int iStack_1430;
  int iStack_142c;
  int iStack_1428;
  int iStack_1424;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined1 local_13a0 [8];
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  undefined4 local_1360;
  undefined4 uStack_135c;
  undefined4 uStack_1358;
  undefined4 uStack_1354;
  undefined4 uStack_1350;
  undefined4 uStack_134c;
  undefined4 uStack_1348;
  undefined4 uStack_1344;
  undefined4 local_1340;
  undefined4 uStack_133c;
  undefined4 uStack_1338;
  undefined4 uStack_1334;
  undefined4 uStack_1330;
  undefined4 uStack_132c;
  undefined4 uStack_1328;
  undefined4 uStack_1324;
  RTCHitN local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined4 local_12c0;
  undefined4 uStack_12bc;
  undefined4 uStack_12b8;
  undefined4 uStack_12b4;
  undefined4 uStack_12b0;
  undefined4 uStack_12ac;
  undefined4 uStack_12a8;
  undefined4 uStack_12a4;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  uVar43 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_15c0._4_4_ = uVar43;
  local_15c0._0_4_ = uVar43;
  local_15c0._8_4_ = uVar43;
  local_15c0._12_4_ = uVar43;
  local_15c0._16_4_ = uVar43;
  local_15c0._20_4_ = uVar43;
  local_15c0._24_4_ = uVar43;
  local_15c0._28_4_ = uVar43;
  auVar92 = ZEXT3264(local_15c0);
  local_1340 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uStack_133c = local_1340;
  uStack_1338 = local_1340;
  uStack_1334 = local_1340;
  uStack_1330 = local_1340;
  uStack_132c = local_1340;
  uStack_1328 = local_1340;
  uStack_1324 = local_1340;
  local_1360 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uStack_135c = local_1360;
  uStack_1358 = local_1360;
  uStack_1354 = local_1360;
  uStack_1350 = local_1360;
  uStack_134c = local_1360;
  uStack_1348 = local_1360;
  uStack_1344 = local_1360;
  local_13e0 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1400 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1420 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1380 = local_13e0 * 0.99999964;
  fStack_137c = local_1380;
  fStack_1378 = local_1380;
  fStack_1374 = local_1380;
  fStack_1370 = local_1380;
  fStack_136c = local_1380;
  fStack_1368 = local_1380;
  fStack_1364 = local_1380;
  fVar14 = local_1400 * 0.99999964;
  local_13a0._4_4_ = fVar14;
  local_13a0._0_4_ = fVar14;
  fStack_1398 = fVar14;
  fStack_1394 = fVar14;
  fStack_1390 = fVar14;
  fStack_138c = fVar14;
  fStack_1388 = fVar14;
  register0x0000131c = fVar14;
  local_13c0 = local_1420 * 0.99999964;
  fStack_13bc = local_13c0;
  fStack_13b8 = local_13c0;
  fStack_13b4 = local_13c0;
  fStack_13b0 = local_13c0;
  fStack_13ac = local_13c0;
  fStack_13a8 = local_13c0;
  fStack_13a4 = local_13c0;
  local_13e0 = local_13e0 * 1.0000004;
  fStack_13dc = local_13e0;
  fStack_13d8 = local_13e0;
  fStack_13d4 = local_13e0;
  fStack_13d0 = local_13e0;
  fStack_13cc = local_13e0;
  fStack_13c8 = local_13e0;
  fStack_13c4 = local_13e0;
  local_1400 = local_1400 * 1.0000004;
  fStack_13fc = local_1400;
  fStack_13f8 = local_1400;
  fStack_13f4 = local_1400;
  fStack_13f0 = local_1400;
  fStack_13ec = local_1400;
  fStack_13e8 = local_1400;
  fStack_13e4 = local_1400;
  local_1420 = local_1420 * 1.0000004;
  fStack_141c = local_1420;
  fStack_1418 = local_1420;
  fStack_1414 = local_1420;
  fStack_1410 = local_1420;
  fStack_140c = local_1420;
  fStack_1408 = local_1420;
  fStack_1404 = local_1420;
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar47 = uVar41 ^ 0x20;
  local_1630 = uVar42 ^ 0x20;
  local_1440 = (tray->tnear).field_0.i[k];
  iStack_143c = local_1440;
  iStack_1438 = local_1440;
  iStack_1434 = local_1440;
  iStack_1430 = local_1440;
  iStack_142c = local_1440;
  iStack_1428 = local_1440;
  iStack_1424 = local_1440;
  local_1460 = (tray->tfar).field_0.i[k];
  iStack_145c = local_1460;
  iStack_1458 = local_1460;
  iStack_1454 = local_1460;
  iStack_1450 = local_1460;
  iStack_144c = local_1460;
  iStack_1448 = local_1460;
  iStack_1444 = local_1460;
  local_15f8 = uVar39 ^ 0x20;
  iVar35 = 1 << ((uint)k & 0x1f);
  auVar55._4_4_ = iVar35;
  auVar55._0_4_ = iVar35;
  auVar55._8_4_ = iVar35;
  auVar55._12_4_ = iVar35;
  auVar55._16_4_ = iVar35;
  auVar55._20_4_ = iVar35;
  auVar55._24_4_ = iVar35;
  auVar55._28_4_ = iVar35;
  auVar16 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar55 = vpand_avx2(auVar55,auVar16);
  local_1480 = vpcmpeqd_avx2(auVar55,auVar16);
  puVar40 = local_11f8;
  uVar44 = local_1630;
  local_1628 = uVar47;
  do {
    local_1600 = puVar40;
    if (local_1600 == &local_1200) break;
    puVar40 = local_1600 + -1;
    uVar46 = local_1600[-1];
    do {
      if ((uVar46 & 8) == 0) {
        uVar36 = uVar46 & 0xfffffffffffffff0;
        uVar43 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar56._4_4_ = uVar43;
        auVar56._0_4_ = uVar43;
        auVar56._8_4_ = uVar43;
        auVar56._12_4_ = uVar43;
        auVar56._16_4_ = uVar43;
        auVar56._20_4_ = uVar43;
        auVar56._24_4_ = uVar43;
        auVar56._28_4_ = uVar43;
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + uVar41),auVar56,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + uVar41));
        auVar55 = vsubps_avx(ZEXT1632(auVar50),auVar92._0_32_);
        auVar16._4_4_ = auVar55._4_4_ * fStack_137c;
        auVar16._0_4_ = auVar55._0_4_ * local_1380;
        auVar16._8_4_ = auVar55._8_4_ * fStack_1378;
        auVar16._12_4_ = auVar55._12_4_ * fStack_1374;
        auVar16._16_4_ = auVar55._16_4_ * fStack_1370;
        auVar16._20_4_ = auVar55._20_4_ * fStack_136c;
        auVar16._24_4_ = auVar55._24_4_ * fStack_1368;
        auVar16._28_4_ = auVar55._28_4_;
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + uVar42),auVar56,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + uVar42));
        auVar32._4_4_ = iStack_143c;
        auVar32._0_4_ = local_1440;
        auVar32._8_4_ = iStack_1438;
        auVar32._12_4_ = iStack_1434;
        auVar32._16_4_ = iStack_1430;
        auVar32._20_4_ = iStack_142c;
        auVar32._24_4_ = iStack_1428;
        auVar32._28_4_ = iStack_1424;
        auVar55 = vmaxps_avx(auVar32,auVar16);
        auVar34._4_4_ = uStack_133c;
        auVar34._0_4_ = local_1340;
        auVar34._8_4_ = uStack_1338;
        auVar34._12_4_ = uStack_1334;
        auVar34._16_4_ = uStack_1330;
        auVar34._20_4_ = uStack_132c;
        auVar34._24_4_ = uStack_1328;
        auVar34._28_4_ = uStack_1324;
        auVar16 = vsubps_avx(ZEXT1632(auVar50),auVar34);
        auVar15._4_4_ = auVar16._4_4_ * (float)local_13a0._4_4_;
        auVar15._0_4_ = auVar16._0_4_ * (float)local_13a0._0_4_;
        auVar15._8_4_ = auVar16._8_4_ * fStack_1398;
        auVar15._12_4_ = auVar16._12_4_ * fStack_1394;
        auVar15._16_4_ = auVar16._16_4_ * fStack_1390;
        auVar15._20_4_ = auVar16._20_4_ * fStack_138c;
        auVar15._24_4_ = auVar16._24_4_ * fStack_1388;
        auVar15._28_4_ = auVar16._28_4_;
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + uVar39),auVar56,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + uVar39));
        auVar33._4_4_ = uStack_135c;
        auVar33._0_4_ = local_1360;
        auVar33._8_4_ = uStack_1358;
        auVar33._12_4_ = uStack_1354;
        auVar33._16_4_ = uStack_1350;
        auVar33._20_4_ = uStack_134c;
        auVar33._24_4_ = uStack_1348;
        auVar33._28_4_ = uStack_1344;
        auVar16 = vsubps_avx(ZEXT1632(auVar50),auVar33);
        auVar17._4_4_ = auVar16._4_4_ * fStack_13bc;
        auVar17._0_4_ = auVar16._0_4_ * local_13c0;
        auVar17._8_4_ = auVar16._8_4_ * fStack_13b8;
        auVar17._12_4_ = auVar16._12_4_ * fStack_13b4;
        auVar17._16_4_ = auVar16._16_4_ * fStack_13b0;
        auVar17._20_4_ = auVar16._20_4_ * fStack_13ac;
        auVar17._24_4_ = auVar16._24_4_ * fStack_13a8;
        auVar17._28_4_ = auVar16._28_4_;
        auVar16 = vmaxps_avx(auVar15,auVar17);
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + uVar47),auVar56,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + uVar47));
        auVar55 = vmaxps_avx(auVar55,auVar16);
        auVar16 = vsubps_avx(ZEXT1632(auVar50),auVar92._0_32_);
        auVar18._4_4_ = auVar16._4_4_ * fStack_13dc;
        auVar18._0_4_ = auVar16._0_4_ * local_13e0;
        auVar18._8_4_ = auVar16._8_4_ * fStack_13d8;
        auVar18._12_4_ = auVar16._12_4_ * fStack_13d4;
        auVar18._16_4_ = auVar16._16_4_ * fStack_13d0;
        auVar18._20_4_ = auVar16._20_4_ * fStack_13cc;
        auVar18._24_4_ = auVar16._24_4_ * fStack_13c8;
        auVar18._28_4_ = auVar16._28_4_;
        auVar31._4_4_ = iStack_145c;
        auVar31._0_4_ = local_1460;
        auVar31._8_4_ = iStack_1458;
        auVar31._12_4_ = iStack_1454;
        auVar31._16_4_ = iStack_1450;
        auVar31._20_4_ = iStack_144c;
        auVar31._24_4_ = iStack_1448;
        auVar31._28_4_ = iStack_1444;
        auVar16 = vminps_avx(auVar31,auVar18);
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + uVar44),auVar56,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + uVar44));
        auVar15 = vsubps_avx(ZEXT1632(auVar50),auVar34);
        auVar19._4_4_ = auVar15._4_4_ * fStack_13fc;
        auVar19._0_4_ = auVar15._0_4_ * local_1400;
        auVar19._8_4_ = auVar15._8_4_ * fStack_13f8;
        auVar19._12_4_ = auVar15._12_4_ * fStack_13f4;
        auVar19._16_4_ = auVar15._16_4_ * fStack_13f0;
        auVar19._20_4_ = auVar15._20_4_ * fStack_13ec;
        auVar19._24_4_ = auVar15._24_4_ * fStack_13e8;
        auVar19._28_4_ = auVar15._28_4_;
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + local_15f8),auVar56,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + local_15f8));
        auVar15 = vsubps_avx(ZEXT1632(auVar50),auVar33);
        auVar20._4_4_ = auVar15._4_4_ * fStack_141c;
        auVar20._0_4_ = auVar15._0_4_ * local_1420;
        auVar20._8_4_ = auVar15._8_4_ * fStack_1418;
        auVar20._12_4_ = auVar15._12_4_ * fStack_1414;
        auVar20._16_4_ = auVar15._16_4_ * fStack_1410;
        auVar20._20_4_ = auVar15._20_4_ * fStack_140c;
        auVar20._24_4_ = auVar15._24_4_ * fStack_1408;
        auVar20._28_4_ = auVar15._28_4_;
        auVar15 = vminps_avx(auVar19,auVar20);
        auVar16 = vminps_avx(auVar16,auVar15);
        auVar55 = vcmpps_avx(auVar55,auVar16,2);
        if (((uint)uVar46 & 7) == 6) {
          auVar16 = vcmpps_avx(*(undefined1 (*) [32])(uVar36 + 0x1c0),auVar56,2);
          auVar15 = vcmpps_avx(auVar56,*(undefined1 (*) [32])(uVar36 + 0x1e0),1);
          auVar16 = vandps_avx(auVar16,auVar15);
          auVar55 = vandps_avx(auVar16,auVar55);
          auVar50 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
        }
        else {
          auVar50 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
        }
        auVar50 = vpsllw_avx(auVar50,0xf);
        auVar50 = vpacksswb_avx(auVar50,auVar50);
        unaff_RBX = (ulong)(byte)(SUB161(auVar50 >> 7,0) & 1 | (SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                                  (SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                                  (SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                                  (SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                                  (SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                                  (SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                                 SUB161(auVar50 >> 0x3f,0) << 7);
      }
      if ((uVar46 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar45 = 4;
        }
        else {
          uVar36 = uVar46 & 0xfffffffffffffff0;
          lVar38 = 0;
          for (uVar46 = unaff_RBX; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
            lVar38 = lVar38 + 1;
          }
          uVar45 = 0;
          for (uVar37 = unaff_RBX - 1 & unaff_RBX; uVar46 = *(ulong *)(uVar36 + lVar38 * 8),
              uVar37 != 0; uVar37 = uVar37 - 1 & uVar37) {
            *puVar40 = uVar46;
            puVar40 = puVar40 + 1;
            lVar38 = 0;
            for (uVar46 = uVar37; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
              lVar38 = lVar38 + 1;
            }
          }
        }
      }
      else {
        uVar45 = 6;
      }
    } while (uVar45 == 0);
    uVar36 = uVar44;
    if (uVar45 == 6) {
      uVar45 = 0;
      local_1610 = (ulong)((uint)uVar46 & 0xf) - 8;
      bVar48 = local_1610 != 0;
      if (bVar48) {
        uVar46 = uVar46 & 0xfffffffffffffff0;
        local_1608 = 0;
        do {
          local_1698 = local_1608 * 0x140;
          uVar43 = *(undefined4 *)(ray + k * 4 + 0xe0);
          auVar71._4_4_ = uVar43;
          auVar71._0_4_ = uVar43;
          auVar71._8_4_ = uVar43;
          auVar71._12_4_ = uVar43;
          auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar46 + 0x90 + local_1698),auVar71,
                                    *(undefined1 (*) [16])(uVar46 + local_1698));
          auVar83 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar46 + 0xa0 + local_1698),auVar71,
                                    *(undefined1 (*) [16])(uVar46 + 0x10 + local_1698));
          auVar61 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar46 + 0xb0 + local_1698),auVar71,
                                    *(undefined1 (*) [16])(uVar46 + 0x20 + local_1698));
          auVar69 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar46 + 0xc0 + local_1698),auVar71,
                                    *(undefined1 (*) [16])(uVar46 + 0x30 + local_1698));
          auVar70 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar46 + 0xd0 + local_1698),auVar71,
                                    *(undefined1 (*) [16])(uVar46 + 0x40 + local_1698));
          auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar46 + 0xe0 + local_1698),auVar71,
                                    *(undefined1 (*) [16])(uVar46 + 0x50 + local_1698));
          auVar73 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar46 + 0xf0 + local_1698),auVar71,
                                    *(undefined1 (*) [16])(uVar46 + 0x60 + local_1698));
          auVar75 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar46 + 0x100 + local_1698),auVar71,
                                    *(undefined1 (*) [16])(uVar46 + 0x70 + local_1698));
          auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar46 + 0x110 + local_1698),auVar71,
                                    *(undefined1 (*) [16])(uVar46 + 0x80 + local_1698));
          uVar43 = *(undefined4 *)(ray + k * 4);
          auVar72._4_4_ = uVar43;
          auVar72._0_4_ = uVar43;
          auVar72._8_4_ = uVar43;
          auVar72._12_4_ = uVar43;
          uVar43 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar98._4_4_ = uVar43;
          auVar98._0_4_ = uVar43;
          auVar98._8_4_ = uVar43;
          auVar98._12_4_ = uVar43;
          uVar43 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar103._4_4_ = uVar43;
          auVar103._0_4_ = uVar43;
          auVar103._8_4_ = uVar43;
          auVar103._12_4_ = uVar43;
          local_1640 = vsubps_avx(auVar50,auVar72);
          local_1650 = vsubps_avx(auVar83,auVar98);
          local_1660 = vsubps_avx(auVar61,auVar103);
          auVar50 = vsubps_avx(auVar69,auVar72);
          auVar83 = vsubps_avx(auVar70,auVar98);
          auVar61 = vsubps_avx(auVar58,auVar103);
          auVar69 = vsubps_avx(auVar73,auVar72);
          auVar70 = vsubps_avx(auVar75,auVar98);
          auVar58 = vsubps_avx(auVar51,auVar103);
          local_1670 = vsubps_avx(auVar69,local_1640);
          local_1540 = vsubps_avx(auVar70,local_1650);
          local_1620 = vsubps_avx(auVar58,local_1660);
          auVar51._0_4_ = auVar69._0_4_ + local_1640._0_4_;
          auVar51._4_4_ = auVar69._4_4_ + local_1640._4_4_;
          auVar51._8_4_ = auVar69._8_4_ + local_1640._8_4_;
          auVar51._12_4_ = auVar69._12_4_ + local_1640._12_4_;
          auVar67._0_4_ = auVar70._0_4_ + local_1650._0_4_;
          auVar67._4_4_ = auVar70._4_4_ + local_1650._4_4_;
          auVar67._8_4_ = auVar70._8_4_ + local_1650._8_4_;
          auVar67._12_4_ = auVar70._12_4_ + local_1650._12_4_;
          fVar14 = local_1660._0_4_;
          auVar73._0_4_ = auVar58._0_4_ + fVar14;
          fVar3 = local_1660._4_4_;
          auVar73._4_4_ = auVar58._4_4_ + fVar3;
          fVar4 = local_1660._8_4_;
          auVar73._8_4_ = auVar58._8_4_ + fVar4;
          fVar5 = local_1660._12_4_;
          auVar73._12_4_ = auVar58._12_4_ + fVar5;
          auVar99._0_4_ = auVar67._0_4_ * local_1620._0_4_;
          auVar99._4_4_ = auVar67._4_4_ * local_1620._4_4_;
          auVar99._8_4_ = auVar67._8_4_ * local_1620._8_4_;
          auVar99._12_4_ = auVar67._12_4_ * local_1620._12_4_;
          auVar75 = vfmsub231ps_fma(auVar99,local_1540,auVar73);
          auVar74._0_4_ = auVar73._0_4_ * local_1670._0_4_;
          auVar74._4_4_ = auVar73._4_4_ * local_1670._4_4_;
          auVar74._8_4_ = auVar73._8_4_ * local_1670._8_4_;
          auVar74._12_4_ = auVar73._12_4_ * local_1670._12_4_;
          auVar73 = vfmsub231ps_fma(auVar74,local_1620,auVar51);
          auVar52._0_4_ = local_1540._0_4_ * auVar51._0_4_;
          auVar52._4_4_ = local_1540._4_4_ * auVar51._4_4_;
          auVar52._8_4_ = local_1540._8_4_ * auVar51._8_4_;
          auVar52._12_4_ = local_1540._12_4_ * auVar51._12_4_;
          auVar51 = vfmsub231ps_fma(auVar52,local_1670,auVar67);
          local_1690._4_4_ = *(float *)(ray + k * 4 + 0xc0);
          auVar94._0_4_ = local_1690._4_4_ * auVar51._0_4_;
          auVar94._4_4_ = local_1690._4_4_ * auVar51._4_4_;
          auVar94._8_4_ = local_1690._4_4_ * auVar51._8_4_;
          auVar94._12_4_ = local_1690._4_4_ * auVar51._12_4_;
          uVar43 = *(undefined4 *)(ray + k * 4 + 0xa0);
          auVar96._4_4_ = uVar43;
          auVar96._0_4_ = uVar43;
          auVar96._8_4_ = uVar43;
          auVar96._12_4_ = uVar43;
          auVar73 = vfmadd231ps_fma(auVar94,auVar96,auVar73);
          uVar43 = *(undefined4 *)(ray + k * 4 + 0x80);
          local_16b0._4_4_ = uVar43;
          local_16b0._0_4_ = uVar43;
          local_16b0._8_4_ = uVar43;
          local_16b0._12_4_ = uVar43;
          local_1570 = vfmadd231ps_fma(auVar73,local_16b0,auVar75);
          local_1550 = vsubps_avx(local_1650,auVar83);
          local_1560 = vsubps_avx(local_1660,auVar61);
          auVar68._0_4_ = local_1650._0_4_ + auVar83._0_4_;
          auVar68._4_4_ = local_1650._4_4_ + auVar83._4_4_;
          auVar68._8_4_ = local_1650._8_4_ + auVar83._8_4_;
          auVar68._12_4_ = local_1650._12_4_ + auVar83._12_4_;
          auVar75._0_4_ = fVar14 + auVar61._0_4_;
          auVar75._4_4_ = fVar3 + auVar61._4_4_;
          auVar75._8_4_ = fVar4 + auVar61._8_4_;
          auVar75._12_4_ = fVar5 + auVar61._12_4_;
          fVar6 = local_1560._0_4_;
          auVar82._0_4_ = auVar68._0_4_ * fVar6;
          fVar8 = local_1560._4_4_;
          auVar82._4_4_ = auVar68._4_4_ * fVar8;
          fVar10 = local_1560._8_4_;
          auVar82._8_4_ = auVar68._8_4_ * fVar10;
          fVar12 = local_1560._12_4_;
          auVar82._12_4_ = auVar68._12_4_ * fVar12;
          auVar51 = vfmsub231ps_fma(auVar82,local_1550,auVar75);
          auVar73 = vsubps_avx(local_1640,auVar50);
          fVar7 = auVar73._0_4_;
          auVar88._0_4_ = auVar75._0_4_ * fVar7;
          fVar9 = auVar73._4_4_;
          auVar88._4_4_ = auVar75._4_4_ * fVar9;
          fVar11 = auVar73._8_4_;
          auVar88._8_4_ = auVar75._8_4_ * fVar11;
          fVar13 = auVar73._12_4_;
          auVar88._12_4_ = auVar75._12_4_ * fVar13;
          auVar76._0_4_ = local_1640._0_4_ + auVar50._0_4_;
          auVar76._4_4_ = local_1640._4_4_ + auVar50._4_4_;
          auVar76._8_4_ = local_1640._8_4_ + auVar50._8_4_;
          auVar76._12_4_ = local_1640._12_4_ + auVar50._12_4_;
          auVar75 = vfmsub231ps_fma(auVar88,local_1560,auVar76);
          fVar97 = local_1550._0_4_;
          auVar77._0_4_ = fVar97 * auVar76._0_4_;
          fVar100 = local_1550._4_4_;
          auVar77._4_4_ = fVar100 * auVar76._4_4_;
          fVar101 = local_1550._8_4_;
          auVar77._8_4_ = fVar101 * auVar76._8_4_;
          fVar102 = local_1550._12_4_;
          auVar77._12_4_ = fVar102 * auVar76._12_4_;
          auVar52 = vfmsub231ps_fma(auVar77,auVar73,auVar68);
          auVar78._0_4_ = local_1690._4_4_ * auVar52._0_4_;
          auVar78._4_4_ = local_1690._4_4_ * auVar52._4_4_;
          auVar78._8_4_ = local_1690._4_4_ * auVar52._8_4_;
          auVar78._12_4_ = local_1690._4_4_ * auVar52._12_4_;
          auVar75 = vfmadd231ps_fma(auVar78,auVar96,auVar75);
          local_1520 = vfmadd231ps_fma(auVar75,local_16b0,auVar51);
          auVar75 = vsubps_avx(auVar50,auVar69);
          auVar60._0_4_ = auVar50._0_4_ + auVar69._0_4_;
          auVar60._4_4_ = auVar50._4_4_ + auVar69._4_4_;
          auVar60._8_4_ = auVar50._8_4_ + auVar69._8_4_;
          auVar60._12_4_ = auVar50._12_4_ + auVar69._12_4_;
          auVar69 = vsubps_avx(auVar83,auVar70);
          auVar57._0_4_ = auVar83._0_4_ + auVar70._0_4_;
          auVar57._4_4_ = auVar83._4_4_ + auVar70._4_4_;
          auVar57._8_4_ = auVar83._8_4_ + auVar70._8_4_;
          auVar57._12_4_ = auVar83._12_4_ + auVar70._12_4_;
          auVar70 = vsubps_avx(auVar61,auVar58);
          auVar50._0_4_ = auVar61._0_4_ + auVar58._0_4_;
          auVar50._4_4_ = auVar61._4_4_ + auVar58._4_4_;
          auVar50._8_4_ = auVar61._8_4_ + auVar58._8_4_;
          auVar50._12_4_ = auVar61._12_4_ + auVar58._12_4_;
          auVar83._0_4_ = auVar70._0_4_ * auVar57._0_4_;
          auVar83._4_4_ = auVar70._4_4_ * auVar57._4_4_;
          auVar83._8_4_ = auVar70._8_4_ * auVar57._8_4_;
          auVar83._12_4_ = auVar70._12_4_ * auVar57._12_4_;
          auVar83 = vfmsub231ps_fma(auVar83,auVar69,auVar50);
          auVar79._0_4_ = auVar50._0_4_ * auVar75._0_4_;
          auVar79._4_4_ = auVar50._4_4_ * auVar75._4_4_;
          auVar79._8_4_ = auVar50._8_4_ * auVar75._8_4_;
          auVar79._12_4_ = auVar50._12_4_ * auVar75._12_4_;
          auVar50 = vfmsub231ps_fma(auVar79,auVar70,auVar60);
          auVar61._0_4_ = auVar69._0_4_ * auVar60._0_4_;
          auVar61._4_4_ = auVar69._4_4_ * auVar60._4_4_;
          auVar61._8_4_ = auVar69._8_4_ * auVar60._8_4_;
          auVar61._12_4_ = auVar69._12_4_ * auVar60._12_4_;
          auVar61 = vfmsub231ps_fma(auVar61,auVar75,auVar57);
          local_1690._0_4_ = local_1690._4_4_;
          fStack_1688 = local_1690._4_4_;
          fStack_1684 = local_1690._4_4_;
          auVar62._0_4_ = local_1690._4_4_ * auVar61._0_4_;
          auVar62._4_4_ = local_1690._4_4_ * auVar61._4_4_;
          auVar62._8_4_ = local_1690._4_4_ * auVar61._8_4_;
          auVar62._12_4_ = local_1690._4_4_ * auVar61._12_4_;
          auVar50 = vfmadd231ps_fma(auVar62,auVar96,auVar50);
          auVar61 = vfmadd231ps_fma(auVar50,local_16b0,auVar83);
          local_1530 = local_1570._0_4_;
          fStack_152c = local_1570._4_4_;
          fStack_1528 = local_1570._8_4_;
          fStack_1524 = local_1570._12_4_;
          local_1510._0_4_ = auVar61._0_4_ + local_1530 + local_1520._0_4_;
          local_1510._4_4_ = auVar61._4_4_ + fStack_152c + local_1520._4_4_;
          local_1510._8_4_ = auVar61._8_4_ + fStack_1528 + local_1520._8_4_;
          local_1510._12_4_ = auVar61._12_4_ + fStack_1524 + local_1520._12_4_;
          auVar58._8_4_ = 0x7fffffff;
          auVar58._0_8_ = 0x7fffffff7fffffff;
          auVar58._12_4_ = 0x7fffffff;
          auVar50 = vminps_avx(local_1570,local_1520);
          auVar50 = vminps_avx(auVar50,auVar61);
          local_1580 = vandps_avx(local_1510,auVar58);
          auVar89._0_4_ = local_1580._0_4_ * 1.1920929e-07;
          auVar89._4_4_ = local_1580._4_4_ * 1.1920929e-07;
          auVar89._8_4_ = local_1580._8_4_ * 1.1920929e-07;
          auVar89._12_4_ = local_1580._12_4_ * 1.1920929e-07;
          uVar47 = CONCAT44(auVar89._4_4_,auVar89._0_4_);
          auVar84._0_8_ = uVar47 ^ 0x8000000080000000;
          auVar84._8_4_ = -auVar89._8_4_;
          auVar84._12_4_ = -auVar89._12_4_;
          auVar50 = vcmpps_avx(auVar50,auVar84,5);
          auVar83 = vmaxps_avx(local_1570,local_1520);
          auVar83 = vmaxps_avx(auVar83,auVar61);
          auVar83 = vcmpps_avx(auVar83,auVar89,2);
          auVar92 = ZEXT3264(local_15c0);
          auVar50 = vorps_avx(auVar50,auVar83);
          if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar50[0xf] < '\0') {
            auVar63._0_4_ = local_1620._0_4_ * fVar97;
            auVar63._4_4_ = local_1620._4_4_ * fVar100;
            auVar63._8_4_ = local_1620._8_4_ * fVar101;
            auVar63._12_4_ = local_1620._12_4_ * fVar102;
            auVar80._0_4_ = fVar7 * local_1540._0_4_;
            auVar80._4_4_ = fVar9 * local_1540._4_4_;
            auVar80._8_4_ = fVar11 * local_1540._8_4_;
            auVar80._12_4_ = fVar13 * local_1540._12_4_;
            auVar51 = vfmsub213ps_fma(local_1540,local_1560,auVar63);
            auVar85._0_4_ = auVar69._0_4_ * fVar6;
            auVar85._4_4_ = auVar69._4_4_ * fVar8;
            auVar85._8_4_ = auVar69._8_4_ * fVar10;
            auVar85._12_4_ = auVar69._12_4_ * fVar12;
            auVar90._0_4_ = fVar7 * auVar70._0_4_;
            auVar90._4_4_ = fVar9 * auVar70._4_4_;
            auVar90._8_4_ = fVar11 * auVar70._8_4_;
            auVar90._12_4_ = fVar13 * auVar70._12_4_;
            auVar70 = vfmsub213ps_fma(auVar70,local_1550,auVar85);
            auVar83 = vandps_avx(auVar63,auVar58);
            auVar61 = vandps_avx(auVar85,auVar58);
            auVar83 = vcmpps_avx(auVar83,auVar61,1);
            local_14b0 = vblendvps_avx(auVar70,auVar51,auVar83);
            auVar86._0_4_ = auVar75._0_4_ * fVar97;
            auVar86._4_4_ = auVar75._4_4_ * fVar100;
            auVar86._8_4_ = auVar75._8_4_ * fVar101;
            auVar86._12_4_ = auVar75._12_4_ * fVar102;
            auVar70 = vfmsub213ps_fma(auVar75,local_1560,auVar90);
            auVar64._0_4_ = local_1670._0_4_ * fVar6;
            auVar64._4_4_ = local_1670._4_4_ * fVar8;
            auVar64._8_4_ = local_1670._8_4_ * fVar10;
            auVar64._12_4_ = local_1670._12_4_ * fVar12;
            auVar75 = vfmsub213ps_fma(local_1620,auVar73,auVar64);
            auVar83 = vandps_avx(auVar64,auVar58);
            auVar61 = vandps_avx(auVar90,auVar58);
            auVar83 = vcmpps_avx(auVar83,auVar61,1);
            local_14a0 = vblendvps_avx(auVar70,auVar75,auVar83);
            auVar70 = vfmsub213ps_fma(local_1670,local_1550,auVar80);
            auVar69 = vfmsub213ps_fma(auVar69,auVar73,auVar86);
            auVar83 = vandps_avx(auVar80,auVar58);
            auVar61 = vandps_avx(auVar86,auVar58);
            auVar83 = vcmpps_avx(auVar83,auVar61,1);
            local_1490 = vblendvps_avx(auVar69,auVar70,auVar83);
            auVar69._0_4_ = local_1490._0_4_ * local_1690._4_4_;
            auVar69._4_4_ = local_1490._4_4_ * local_1690._4_4_;
            auVar69._8_4_ = local_1490._8_4_ * local_1690._4_4_;
            auVar69._12_4_ = local_1490._12_4_ * local_1690._4_4_;
            auVar83 = vfmadd213ps_fma(auVar96,local_14a0,auVar69);
            auVar83 = vfmadd213ps_fma(local_16b0,local_14b0,auVar83);
            auVar81._0_4_ = auVar83._0_4_ + auVar83._0_4_;
            auVar81._4_4_ = auVar83._4_4_ + auVar83._4_4_;
            auVar81._8_4_ = auVar83._8_4_ + auVar83._8_4_;
            auVar81._12_4_ = auVar83._12_4_ + auVar83._12_4_;
            auVar70._0_4_ = local_1490._0_4_ * fVar14;
            auVar70._4_4_ = local_1490._4_4_ * fVar3;
            auVar70._8_4_ = local_1490._8_4_ * fVar4;
            auVar70._12_4_ = local_1490._12_4_ * fVar5;
            auVar83 = vfmadd213ps_fma(local_1650,local_14a0,auVar70);
            auVar61 = vfmadd213ps_fma(local_1640,local_14b0,auVar83);
            auVar83 = vrcpps_avx(auVar81);
            auVar95._8_4_ = 0x3f800000;
            auVar95._0_8_ = &DAT_3f8000003f800000;
            auVar95._12_4_ = 0x3f800000;
            auVar69 = vfnmadd213ps_fma(auVar83,auVar81,auVar95);
            auVar83 = vfmadd132ps_fma(auVar69,auVar83,auVar83);
            local_14c0._0_4_ = (auVar61._0_4_ + auVar61._0_4_) * auVar83._0_4_;
            local_14c0._4_4_ = (auVar61._4_4_ + auVar61._4_4_) * auVar83._4_4_;
            local_14c0._8_4_ = (auVar61._8_4_ + auVar61._8_4_) * auVar83._8_4_;
            local_14c0._12_4_ = (auVar61._12_4_ + auVar61._12_4_) * auVar83._12_4_;
            uVar43 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar87._4_4_ = uVar43;
            auVar87._0_4_ = uVar43;
            auVar87._8_4_ = uVar43;
            auVar87._12_4_ = uVar43;
            auVar83 = vcmpps_avx(auVar87,local_14c0,2);
            uVar43 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar91._4_4_ = uVar43;
            auVar91._0_4_ = uVar43;
            auVar91._8_4_ = uVar43;
            auVar91._12_4_ = uVar43;
            auVar61 = vcmpps_avx(local_14c0,auVar91,2);
            auVar83 = vandps_avx(auVar83,auVar61);
            auVar92 = ZEXT3264(local_15c0);
            auVar61 = auVar50 & auVar83;
            if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar61[0xf] < '\0') {
              auVar50 = vandps_avx(auVar50,auVar83);
              auVar83 = vcmpps_avx(auVar81,_DAT_01feba10,4);
              auVar61 = auVar83 & auVar50;
              if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar61[0xf] < '\0') {
                local_1698 = local_1698 + uVar46;
                local_14f0 = vandps_avx(auVar50,auVar83);
                local_1500 = &local_16b1;
                uStack_1678 = auVar96._8_8_;
                local_1680 = context->scene;
                auVar50 = vrcpps_avx(local_1510);
                auVar65._8_4_ = 0x3f800000;
                auVar65._0_8_ = &DAT_3f8000003f800000;
                auVar65._12_4_ = 0x3f800000;
                auVar83 = vfnmadd213ps_fma(local_1510,auVar50,auVar65);
                auVar83 = vfmadd132ps_fma(auVar83,auVar50,auVar50);
                auVar59._8_4_ = 0x219392ef;
                auVar59._0_8_ = 0x219392ef219392ef;
                auVar59._12_4_ = 0x219392ef;
                auVar50 = vcmpps_avx(local_1580,auVar59,5);
                auVar50 = vandps_avx(auVar83,auVar50);
                auVar53._0_4_ = local_1530 * auVar50._0_4_;
                auVar53._4_4_ = fStack_152c * auVar50._4_4_;
                auVar53._8_4_ = fStack_1528 * auVar50._8_4_;
                auVar53._12_4_ = fStack_1524 * auVar50._12_4_;
                local_14e0 = vminps_avx(auVar53,auVar65);
                auVar54._0_4_ = auVar50._0_4_ * local_1520._0_4_;
                auVar54._4_4_ = auVar50._4_4_ * local_1520._4_4_;
                auVar54._8_4_ = auVar50._8_4_ * local_1520._8_4_;
                auVar54._12_4_ = auVar50._12_4_ * local_1520._12_4_;
                local_14d0 = vminps_avx(auVar54,auVar65);
                uVar43 = vmovmskps_avx(local_14f0);
                uVar44 = CONCAT44((int)(uVar44 >> 0x20),uVar43);
                do {
                  uVar47 = 0;
                  for (uVar36 = uVar44; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000
                      ) {
                    uVar47 = uVar47 + 1;
                  }
                  uVar45 = *(uint *)(local_1698 + 0x120 + uVar47 * 4);
                  lVar38 = *(long *)(*(long *)((long)local_1680 + 0x1e8) + (ulong)uVar45 * 8);
                  if ((*(uint *)(lVar38 + 0x34) & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    uVar44 = uVar44 ^ 1L << (uVar47 & 0x3f);
                    bVar49 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (*(long *)(lVar38 + 0x48) == 0)) {
                    bVar49 = false;
                  }
                  else {
                    local_1690 = uVar39;
                    uVar39 = (ulong)(uint)((int)uVar47 * 4);
                    uVar93 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_12c0 = *(undefined4 *)(local_14e0 + uVar39);
                    uVar43 = *(undefined4 *)(local_14d0 + uVar39);
                    local_12a0._4_4_ = uVar43;
                    local_12a0._0_4_ = uVar43;
                    local_12a0._8_4_ = uVar43;
                    local_12a0._12_4_ = uVar43;
                    local_12a0._16_4_ = uVar43;
                    local_12a0._20_4_ = uVar43;
                    local_12a0._24_4_ = uVar43;
                    local_12a0._28_4_ = uVar43;
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_14c0 + uVar39);
                    local_15f0.context = context->user;
                    uVar43 = *(undefined4 *)(local_1698 + 0x130 + uVar39);
                    local_1280._4_4_ = uVar43;
                    local_1280._0_4_ = uVar43;
                    local_1280._8_4_ = uVar43;
                    local_1280._12_4_ = uVar43;
                    local_1280._16_4_ = uVar43;
                    local_1280._20_4_ = uVar43;
                    local_1280._24_4_ = uVar43;
                    local_1280._28_4_ = uVar43;
                    uVar43 = *(undefined4 *)(local_14b0 + uVar39);
                    uVar1 = *(undefined4 *)(local_14a0 + uVar39);
                    local_1300._4_4_ = uVar1;
                    local_1300._0_4_ = uVar1;
                    local_1300._8_4_ = uVar1;
                    local_1300._12_4_ = uVar1;
                    local_1300._16_4_ = uVar1;
                    local_1300._20_4_ = uVar1;
                    local_1300._24_4_ = uVar1;
                    local_1300._28_4_ = uVar1;
                    uVar1 = *(undefined4 *)(local_1490 + uVar39);
                    local_12e0._4_4_ = uVar1;
                    local_12e0._0_4_ = uVar1;
                    local_12e0._8_4_ = uVar1;
                    local_12e0._12_4_ = uVar1;
                    local_12e0._16_4_ = uVar1;
                    local_12e0._20_4_ = uVar1;
                    local_12e0._24_4_ = uVar1;
                    local_12e0._28_4_ = uVar1;
                    local_1260._4_4_ = uVar45;
                    local_1260._0_4_ = uVar45;
                    local_1260._8_4_ = uVar45;
                    local_1260._12_4_ = uVar45;
                    local_1260._16_4_ = uVar45;
                    local_1260._20_4_ = uVar45;
                    local_1260._24_4_ = uVar45;
                    local_1260._28_4_ = uVar45;
                    local_1320[0] = (RTCHitN)(char)uVar43;
                    local_1320[1] = (RTCHitN)(char)((uint)uVar43 >> 8);
                    local_1320[2] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
                    local_1320[3] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
                    local_1320[4] = (RTCHitN)(char)uVar43;
                    local_1320[5] = (RTCHitN)(char)((uint)uVar43 >> 8);
                    local_1320[6] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
                    local_1320[7] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
                    local_1320[8] = (RTCHitN)(char)uVar43;
                    local_1320[9] = (RTCHitN)(char)((uint)uVar43 >> 8);
                    local_1320[10] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
                    local_1320[0xb] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
                    local_1320[0xc] = (RTCHitN)(char)uVar43;
                    local_1320[0xd] = (RTCHitN)(char)((uint)uVar43 >> 8);
                    local_1320[0xe] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
                    local_1320[0xf] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
                    local_1320[0x10] = (RTCHitN)(char)uVar43;
                    local_1320[0x11] = (RTCHitN)(char)((uint)uVar43 >> 8);
                    local_1320[0x12] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
                    local_1320[0x13] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
                    local_1320[0x14] = (RTCHitN)(char)uVar43;
                    local_1320[0x15] = (RTCHitN)(char)((uint)uVar43 >> 8);
                    local_1320[0x16] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
                    local_1320[0x17] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
                    local_1320[0x18] = (RTCHitN)(char)uVar43;
                    local_1320[0x19] = (RTCHitN)(char)((uint)uVar43 >> 8);
                    local_1320[0x1a] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
                    local_1320[0x1b] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
                    local_1320[0x1c] = (RTCHitN)(char)uVar43;
                    local_1320[0x1d] = (RTCHitN)(char)((uint)uVar43 >> 8);
                    local_1320[0x1e] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
                    local_1320[0x1f] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
                    uStack_12bc = local_12c0;
                    uStack_12b8 = local_12c0;
                    uStack_12b4 = local_12c0;
                    uStack_12b0 = local_12c0;
                    uStack_12ac = local_12c0;
                    uStack_12a8 = local_12c0;
                    uStack_12a4 = local_12c0;
                    auVar55 = vpcmpeqd_avx2(local_1260,local_1260);
                    uStack_123c = (local_15f0.context)->instID[0];
                    local_1240 = uStack_123c;
                    uStack_1238 = uStack_123c;
                    uStack_1234 = uStack_123c;
                    uStack_1230 = uStack_123c;
                    uStack_122c = uStack_123c;
                    uStack_1228 = uStack_123c;
                    uStack_1224 = uStack_123c;
                    uStack_121c = (local_15f0.context)->instPrimID[0];
                    local_1220 = uStack_121c;
                    uStack_1218 = uStack_121c;
                    uStack_1214 = uStack_121c;
                    uStack_1210 = uStack_121c;
                    uStack_120c = uStack_121c;
                    uStack_1208 = uStack_121c;
                    uStack_1204 = uStack_121c;
                    local_15a0 = local_1480._0_8_;
                    uStack_1598 = local_1480._8_8_;
                    uStack_1590 = local_1480._16_8_;
                    uStack_1588 = local_1480._24_8_;
                    local_15f0.valid = (int *)&local_15a0;
                    local_15f0.geometryUserPtr = *(void **)(lVar38 + 0x18);
                    local_15f0.hit = local_1320;
                    local_15f0.N = 8;
                    local_15f0.ray = (RTCRayN *)ray;
                    if (*(code **)(lVar38 + 0x48) != (code *)0x0) {
                      local_16b0._0_8_ = ray;
                      local_1620._0_8_ = k;
                      local_1640._0_8_ = puVar40;
                      local_1650._0_8_ = uVar41;
                      local_1660._0_8_ = uVar42;
                      local_1670._0_4_ = uVar93;
                      auVar55 = ZEXT1632(auVar55._0_16_);
                      (**(code **)(lVar38 + 0x48))(&local_15f0);
                      auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
                      auVar92 = ZEXT3264(local_15c0);
                      k = local_1620._0_8_;
                      puVar40 = (ulong *)local_1640._0_8_;
                      ray = (RayK<8> *)local_16b0._0_8_;
                      uVar41 = local_1650._0_8_;
                      uVar42 = local_1660._0_8_;
                      uVar93 = local_1670._0_4_;
                    }
                    auVar29._8_8_ = uStack_1598;
                    auVar29._0_8_ = local_15a0;
                    auVar29._16_8_ = uStack_1590;
                    auVar29._24_8_ = uStack_1588;
                    auVar15 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar29);
                    auVar16 = auVar55 & ~auVar15;
                    if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar16 >> 0x7f,0) == '\0') &&
                          (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar16 >> 0xbf,0) == '\0') &&
                        (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar16[0x1f]) {
                      auVar15 = auVar15 ^ auVar55;
                      uVar39 = local_1690;
                    }
                    else {
                      p_Var2 = context->args->filter;
                      if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(lVar38 + 0x3e) & 0x40) != 0)
                          ))) {
                        local_16b0._0_8_ = ray;
                        local_1640._0_8_ = puVar40;
                        local_1650._0_8_ = uVar41;
                        local_1660._0_8_ = uVar42;
                        local_1670._0_4_ = uVar93;
                        auVar55 = ZEXT1632(auVar55._0_16_);
                        (*p_Var2)(&local_15f0);
                        auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
                        auVar92 = ZEXT3264(local_15c0);
                        puVar40 = (ulong *)local_1640._0_8_;
                        ray = (RayK<8> *)local_16b0._0_8_;
                        uVar41 = local_1650._0_8_;
                        uVar42 = local_1660._0_8_;
                        uVar93 = local_1670._0_4_;
                      }
                      auVar30._8_8_ = uStack_1598;
                      auVar30._0_8_ = local_15a0;
                      auVar30._16_8_ = uStack_1590;
                      auVar30._24_8_ = uStack_1588;
                      auVar16 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar30);
                      auVar15 = auVar16 ^ auVar55;
                      auVar66._8_4_ = 0xff800000;
                      auVar66._0_8_ = 0xff800000ff800000;
                      auVar66._12_4_ = 0xff800000;
                      auVar66._16_4_ = 0xff800000;
                      auVar66._20_4_ = 0xff800000;
                      auVar66._24_4_ = 0xff800000;
                      auVar66._28_4_ = 0xff800000;
                      auVar55 = vblendvps_avx(auVar66,*(undefined1 (*) [32])(local_15f0.ray + 0x100)
                                              ,auVar16);
                      *(undefined1 (*) [32])(local_15f0.ray + 0x100) = auVar55;
                      uVar39 = local_1690;
                    }
                    bVar27 = (auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar28 = (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar26 = (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar25 = SUB321(auVar15 >> 0x7f,0) == '\0';
                    bVar24 = (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar23 = SUB321(auVar15 >> 0xbf,0) == '\0';
                    bVar22 = (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar21 = -1 < auVar15[0x1f];
                    bVar49 = ((((((bVar27 && bVar28) && bVar26) && bVar25) && bVar24) && bVar23) &&
                             bVar22) && bVar21;
                    if (((((((bVar27 && bVar28) && bVar26) && bVar25) && bVar24) && bVar23) &&
                        bVar22) && bVar21) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar93;
                      uVar44 = uVar44 ^ 1L << (uVar47 & 0x3f);
                    }
                  }
                  uVar45 = 0;
                  if (!bVar49) {
                    uVar36 = local_1630;
                    uVar47 = local_1628;
                    if (bVar48) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                      uVar45 = 1;
                    }
                    goto LAB_006bce47;
                  }
                } while (uVar44 != 0);
                uVar44 = 0;
              }
            }
          }
          uVar45 = 0;
          local_1608 = local_1608 + 1;
          bVar48 = local_1608 < local_1610;
          uVar36 = local_1630;
          uVar47 = local_1628;
        } while (local_1608 != local_1610);
      }
    }
LAB_006bce47:
    uVar44 = uVar36;
  } while ((uVar45 & 3) == 0);
  return local_1600 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }